

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_encoder.cpp
# Opt level: O1

void __thiscall
duckdb::CSVEncoder::CSVEncoder
          (CSVEncoder *this,DBConfig *config,string *encoding_name_to_find,idx_t buffer_size)

{
  pointer pcVar1;
  ostream *poVar2;
  InvalidInputException *this_00;
  idx_t encoded_size;
  pointer *__ptr;
  pointer prVar3;
  pointer *__ptr_1;
  optional_ptr<duckdb::EncodingFunction,_true> function;
  vector<std::reference_wrapper<duckdb::EncodingFunction>,_true> loaded_encodings;
  ostringstream error;
  char local_1e9;
  optional_ptr<duckdb::EncodingFunction,_true> local_1e8;
  string local_1e0;
  vector<std::reference_wrapper<duckdb::EncodingFunction>,_true> local_1c0;
  string local_1a8 [11];
  
  (this->encoding_name)._M_dataplus._M_p = (pointer)&(this->encoding_name).field_2;
  (this->encoding_name)._M_string_length = 0;
  (this->encoding_name).field_2._M_local_buf[0] = '\0';
  (this->encoded_buffer).cur_pos = 0;
  (this->encoded_buffer).actual_encoded_buffer_size = 0;
  (this->encoded_buffer).last_buffer = false;
  this->has_pass_on_byte = false;
  (this->encoded_buffer).encoded_buffer._M_t.
  super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  (this->encoded_buffer).encoded_buffer_size = 0;
  (this->remaining_bytes_buffer).cur_pos = 0;
  (this->remaining_bytes_buffer).actual_encoded_buffer_size = 0;
  (this->remaining_bytes_buffer).last_buffer = false;
  (this->remaining_bytes_buffer).encoded_buffer._M_t.
  super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  (this->remaining_bytes_buffer).encoded_buffer_size = 0;
  (this->encoding_function).ptr = (EncodingFunction *)0x0;
  StringUtil::Lower(local_1a8,encoding_name_to_find);
  ::std::__cxx11::string::operator=((string *)this,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p);
  }
  local_1e8 = DBConfig::GetEncodeFunction(config,encoding_name_to_find);
  if (local_1e8.ptr == (EncodingFunction *)0x0) {
    DBConfig::GetLoadedEncodedFunctions(&local_1c0,config);
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The CSV Reader does not support the encoding: \"",0x2f);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(encoding_name_to_find->_M_dataplus)._M_p,
                        encoding_name_to_find->_M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The currently supported encodings are: ",0x27);
    local_1e0._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1e0,1);
    if (local_1c0.
        super_vector<std::reference_wrapper<duckdb::EncodingFunction>,_std::allocator<std::reference_wrapper<duckdb::EncodingFunction>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::EncodingFunction>,_std::allocator<std::reference_wrapper<duckdb::EncodingFunction>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1c0.
        super_vector<std::reference_wrapper<duckdb::EncodingFunction>,_std::allocator<std::reference_wrapper<duckdb::EncodingFunction>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::EncodingFunction>,_std::allocator<std::reference_wrapper<duckdb::EncodingFunction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      prVar3 = local_1c0.
               super_vector<std::reference_wrapper<duckdb::EncodingFunction>,_std::allocator<std::reference_wrapper<duckdb::EncodingFunction>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::EncodingFunction>,_std::allocator<std::reference_wrapper<duckdb::EncodingFunction>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"*  ",3);
        pcVar1 = (prVar3->_M_data->name)._M_dataplus._M_p;
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e0,pcVar1,pcVar1 + (prVar3->_M_data->name)._M_string_length);
        poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,
                            local_1e0._M_string_length);
        local_1e9 = '\n';
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1e9,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p);
        }
        prVar3 = prVar3 + 1;
      } while (prVar3 != local_1c0.
                         super_vector<std::reference_wrapper<duckdb::EncodingFunction>,_std::allocator<std::reference_wrapper<duckdb::EncodingFunction>_>_>
                         .
                         super__Vector_base<std::reference_wrapper<duckdb::EncodingFunction>,_std::allocator<std::reference_wrapper<duckdb::EncodingFunction>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::stringbuf::str();
    InvalidInputException::InvalidInputException(this_00,&local_1e0);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  encoded_size = 2;
  if ((buffer_size & 0xfffffffffffffffe) != 0) {
    encoded_size = buffer_size & 0xfffffffffffffffe;
  }
  CSVEncoderBuffer::Initialize(&this->encoded_buffer,encoded_size);
  optional_ptr<duckdb::EncodingFunction,_true>::CheckValid(&local_1e8);
  CSVEncoderBuffer::Initialize
            (&this->remaining_bytes_buffer,(local_1e8.ptr)->max_bytes_per_iteration);
  (this->encoding_function).ptr = local_1e8.ptr;
  return;
}

Assistant:

CSVEncoder::CSVEncoder(const DBConfig &config, const string &encoding_name_to_find, idx_t buffer_size) {
	encoding_name = StringUtil::Lower(encoding_name_to_find);
	auto function = config.GetEncodeFunction(encoding_name_to_find);
	if (!function) {
		auto loaded_encodings = config.GetLoadedEncodedFunctions();
		std::ostringstream error;
		error << "The CSV Reader does not support the encoding: \"" << encoding_name_to_find << "\"\n";
		error << "The currently supported encodings are: " << '\n';
		for (auto &encoding_function : loaded_encodings) {
			error << "*  " << encoding_function.get().GetName() << '\n';
		}
		throw InvalidInputException(error.str());
	}
	// We ensure that the encoded buffer size is an even number to make the two byte lookup on utf-16 work
	idx_t encoded_buffer_size = buffer_size % 2 != 0 ? buffer_size - 1 : buffer_size;
	if (encoded_buffer_size == 0) {
		// This might happen if buffer size = 1
		encoded_buffer_size = 2;
	}
	D_ASSERT(encoded_buffer_size > 0);
	encoded_buffer.Initialize(encoded_buffer_size);
	remaining_bytes_buffer.Initialize(function->GetBytesPerIteration());
	encoding_function = function;
}